

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

void notifyCurl(CURLM *curl,curl_socket_t s,int evBitmask,char *info)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 local_24;
  CURLMcode result;
  int numhandles;
  char *info_local;
  int evBitmask_local;
  curl_socket_t s_local;
  CURLM *curl_local;
  
  local_24 = 0;
  _result = info;
  info_local._0_4_ = evBitmask;
  info_local._4_4_ = s;
  _evBitmask_local = curl;
  iVar3 = curl_multi_socket_action(curl,s,evBitmask,&local_24);
  pcVar2 = _result;
  uVar1 = _stderr;
  if (iVar3 != 0) {
    uVar4 = curl_multi_strerror(iVar3);
    curl_mfprintf(uVar1,"Curl error on %s: %i (%s)\n",pcVar2,iVar3,uVar4);
  }
  return;
}

Assistant:

static void notifyCurl(CURLM *curl, curl_socket_t s, int evBitmask,
                       const char *info)
{
  int numhandles = 0;
  CURLMcode result = curl_multi_socket_action(curl, s, evBitmask, &numhandles);
  if(result != CURLM_OK) {
    fprintf(stderr, "Curl error on %s: %i (%s)\n",
            info, result, curl_multi_strerror(result));
  }
}